

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dictionary.h
# Opt level: O3

bool __thiscall
JsUtil::
WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
::Clean(WeaklyReferencedKeyDictionary<Js::RecyclableObject,_bool,_RecyclerPointerComparer<const_Js::RecyclableObject_*>,_true>
        *this)

{
  if ((this->disableCleanup == false) &&
     (this->recycler->weakReferenceCleanupId != this->lastWeakReferenceCleanupId)) {
    WeaklyReferencedKeyDictionary<Js::RecyclableObject,bool,RecyclerPointerComparer<Js::RecyclableObject_const*>,true>
    ::
    Map<JsUtil::WeaklyReferencedKeyDictionary<Js::RecyclableObject,bool,RecyclerPointerComparer<Js::RecyclableObject_const*>,true>::Clean()::_lambda(Js::RecyclableObject*,bool,Memory::RecyclerWeakReference<Js::RecyclableObject>const*)_1_>
              ((WeaklyReferencedKeyDictionary<Js::RecyclableObject,bool,RecyclerPointerComparer<Js::RecyclableObject_const*>,true>
                *)this);
    this->lastWeakReferenceCleanupId = this->recycler->weakReferenceCleanupId;
  }
  return 0 < this->freeCount;
}

Assistant:

bool Clean()
        {
            if (!disableCleanup && recycler->GetWeakReferenceCleanupId() != this->lastWeakReferenceCleanupId)
            {
                Map([](TKey * key, TValue value, const RecyclerWeakReference<TKey>* weakRef) {});
                this->lastWeakReferenceCleanupId = recycler->GetWeakReferenceCleanupId();
            }

            return freeCount > 0;
        }